

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# satSolver2.c
# Opt level: O3

void sat_solver2_reducedb(sat_solver2 *s)

{
  ABC_INT64_T *pAVar1;
  uint *puVar2;
  word *pwVar3;
  uint nSize;
  int *piVar4;
  Prf_Man_t *pPVar5;
  Vec_Wrd_t *pVVar6;
  Vec_Int_t *pVVar7;
  word *pwVar8;
  cla *pcVar9;
  veci *pvVar10;
  int iVar11;
  uint uVar12;
  int *pCosts;
  int *piVar13;
  int iVar14;
  int **ppiVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  uint uVar21;
  uint uVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint uVar26;
  uint *puVar27;
  int iVar28;
  uint uVar29;
  double dVar30;
  timespec ts;
  timespec local_48;
  long local_38;
  
  nSize = (s->act_clas).size;
  piVar13 = (s->act_clas).ptr;
  iVar11 = clock_gettime(3,&local_48);
  if (iVar11 < 0) {
    local_38 = 1;
  }
  else {
    lVar17 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_48.tv_nsec),8);
    local_38 = ((lVar17 >> 7) - (lVar17 >> 0x3f)) + local_48.tv_sec * -1000000;
  }
  sat_solver2_reducedb::Count = sat_solver2_reducedb::Count + 1;
  if (s->nLearntMax == 0) {
    __assert_fail("s->nLearntMax",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x58b,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  iVar11 = s->nDBreduces + 1;
  s->nDBreduces = iVar11;
  iVar28 = iVar11 * s->nLearntDelta + s->nLearntStart;
  s->nLearntMax = iVar28;
  iVar11 = s->nLearntRatio;
  pCosts = (int *)malloc((long)(int)nSize * 4);
  iVar20 = (s->Mem).iPage[1];
  if (iVar20 < 1) {
    puVar27 = (uint *)0x0;
  }
  else {
    ppiVar15 = (s->Mem).pPages;
    lVar17 = 1;
    puVar27 = (uint *)0x0;
    do {
      piVar4 = ppiVar15[lVar17];
      if (2 < *piVar4) {
        uVar21 = 2;
        do {
          puVar27 = (uint *)(piVar4 + uVar21);
          uVar22 = *puVar27 >> 3 & 0xff;
          if (6 < uVar22) {
            uVar22 = 7;
          }
          uVar24 = piVar13[(int)puVar27[(ulong)(*puVar27 >> 0xb) + 1]] >> 4;
          pCosts[(int)puVar27[(ulong)(*puVar27 >> 0xb) + 1]] = (uVar22 ^ 7) << 0x1c | uVar24;
          if ((int)uVar24 < 0) {
            __assert_fail("pSortValues[Id] >= 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5ab,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          uVar21 = uVar21 + ((*puVar27 & 1) + (*puVar27 >> 0xb) + 2 & 0xfffffffe);
        } while ((int)uVar21 < *piVar4);
      }
      lVar17 = lVar17 + 2;
    } while ((int)lVar17 <= iVar20);
  }
  piVar13 = Abc_MergeSortCost(pCosts,nSize);
  if (pCosts[piVar13[(long)(int)nSize + -1]] < pCosts[*piVar13]) {
    __assert_fail("pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]]",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                  ,0x5af,"void sat_solver2_reducedb(sat_solver2 *)");
  }
  iVar20 = (int)((ulong)((long)iVar28 * -0x66666667) >> 0x20);
  iVar28 = ((iVar20 >> 3) - (iVar20 >> 0x1f)) + nSize;
  iVar11 = (int)((ulong)((long)(int)(iVar11 * nSize) * -0x51eb851f) >> 0x20);
  iVar11 = pCosts[piVar13[(int)(((iVar11 >> 5) - (iVar11 >> 0x1f)) + nSize)]];
  free(piVar13);
  iVar20 = (s->Mem).iPage[1];
  if (iVar20 < 1) {
    iVar19 = 0;
  }
  else {
    iVar18 = 0;
    lVar17 = 1;
    iVar19 = 0;
    do {
      piVar13 = (s->Mem).pPages[lVar17];
      if (2 < *piVar13) {
        uVar25 = 2;
        do {
          iVar14 = iVar18;
          uVar21 = piVar13[uVar25];
          if ((uVar21 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5b8,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          puVar27 = (uint *)(piVar13 + uVar25);
          if (((iVar14 <= iVar28) && (0xfff < uVar21)) &&
             (pCosts[(int)puVar27[(ulong)(uVar21 >> 0xb) + 1]] < iVar11)) {
            iVar19 = iVar19 + (uint)(s->reasons[(int)puVar27[1] >> 1] !=
                                    ((int)lVar17 << ((byte)(s->Mem).nPageSize & 0x1f) | (uint)uVar25
                                    ));
          }
          if ((int)nSize / 6 <= iVar19) break;
          uVar21 = (uint)uVar25 + ((uVar21 >> 0xb) + (uVar21 & 1) + 2 & 0xfffffffe);
          uVar25 = (ulong)uVar21;
          iVar18 = iVar14 + 1;
        } while ((int)uVar21 < *piVar13);
        iVar18 = iVar14 + 1;
      }
      lVar17 = lVar17 + 2;
    } while ((int)lVar17 <= iVar20);
  }
  if (iVar19 < (int)nSize / 6) {
    if (pCosts != (int *)0x0) {
      free(pCosts);
    }
  }
  else {
    uVar21 = 0;
    if ((s->claProofs).size == 0) {
      piVar13 = (int *)0x0;
    }
    else {
      piVar13 = (s->claProofs).ptr;
    }
    if (iVar20 < 1) {
      uVar22 = 0;
    }
    else {
      ppiVar15 = (s->Mem).pPages;
      uVar22 = 0;
      lVar17 = 1;
      uVar21 = 0;
      do {
        if (2 < *ppiVar15[lVar17]) {
          if (ppiVar15[lVar17] == (int *)0x0) {
            puVar27 = (uint *)0x0;
          }
          else {
            puVar27 = (uint *)(ppiVar15[lVar17] + 2);
            uVar25 = 2;
            while( true ) {
              uVar24 = *puVar27;
              if ((uVar24 & 2) != 0) {
                __assert_fail("c->mark == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                              ,0x5cc,"void sat_solver2_reducedb(sat_solver2 *)");
              }
              uVar12 = uVar24 >> 0xb;
              if (((iVar28 < (int)uVar22) || (uVar24 < 0x1000)) ||
                 ((iVar11 <= pCosts[(int)puVar27[(ulong)uVar12 + 1]] ||
                  (s->reasons[(int)puVar27[1] >> 1] ==
                   ((int)lVar17 << ((byte)(s->Mem).nPageSize & 0x1f) | (uint)uVar25))))) {
                pCosts[(int)uVar21] = pCosts[(int)puVar27[(ulong)uVar12 + 1]];
                if (piVar13 != (int *)0x0) {
                  piVar13[(int)uVar21] = piVar13[(int)puVar27[(ulong)(*puVar27 >> 0xb) + 1]];
                }
                pPVar5 = s->pPrf2;
                if (pPVar5 != (Prf_Man_t *)0x0) {
                  if (pPVar5->iFirst < 0) {
                    __assert_fail("p->iFirst >= 0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                  ,0xb1,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
                  }
                  uVar24 = puVar27[(ulong)(*puVar27 >> 0xb) + 1];
                  if (pPVar5->iFirst <= (int)uVar24) {
                    if (pPVar5->vSaved->nSize == 0) {
                      if (pPVar5->iFirst2 != -1) {
                        __assert_fail("p->iFirst2 == -1",
                                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                                      ,0xb6,"void Prf_ManAddSaved(Prf_Man_t *, int, int)");
                      }
                      pPVar5->iFirst2 = uVar21;
                    }
                    Vec_IntPush(pPVar5->vSaved,uVar24);
                  }
                }
                uVar21 = uVar21 + 1;
              }
              else {
                *puVar27 = uVar24 | 2;
                pAVar1 = &(s->stats).learnts_literals;
                *pAVar1 = *pAVar1 - (ulong)uVar12;
                puVar2 = &(s->stats).learnts;
                *puVar2 = *puVar2 - 1;
              }
              uVar24 = (uint)uVar25 + ((*puVar27 & 1) + (*puVar27 >> 0xb) + 2 & 0xfffffffe);
              uVar25 = (ulong)uVar24;
              ppiVar15 = (s->Mem).pPages;
              if (*ppiVar15[lVar17] <= (int)uVar24) break;
              puVar27 = (uint *)(ppiVar15[lVar17] + uVar25);
              uVar22 = uVar22 + 1;
            }
            uVar22 = uVar22 + 1;
          }
          iVar20 = (s->Mem).iPage[1];
        }
        lVar17 = lVar17 + 2;
      } while ((int)lVar17 <= iVar20);
    }
    if (pCosts != (int *)0x0) {
      free(pCosts);
    }
    pPVar5 = s->pPrf2;
    if (pPVar5 != (Prf_Man_t *)0x0) {
      iVar11 = pPVar5->iFirst;
      if (iVar11 < 0) {
        __assert_fail("p->iFirst >= 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xbe,"void Prf_ManCompact(Prf_Man_t *, int)");
      }
      if (pPVar5->pInfo != (word *)0x0) {
        __assert_fail("p->pInfo == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                      ,0xbf,"void Prf_ManCompact(Prf_Man_t *, int)");
      }
      uVar24 = pPVar5->nWords;
      pVVar6 = pPVar5->vInfo;
      uVar12 = pVVar6->nSize;
      pVVar7 = pPVar5->vSaved;
      iVar20 = pVVar7->nSize;
      if ((long)iVar20 < 1) {
        uVar26 = 0;
      }
      else {
        piVar13 = pVVar7->pArray;
        lVar17 = 0;
        uVar26 = 0;
        do {
          iVar28 = piVar13[lVar17] - iVar11;
          if ((iVar28 < 0) || ((int)uVar12 / (int)uVar24 <= iVar28)) {
            __assert_fail("Entry - p->iFirst >= 0 && Entry - p->iFirst < nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satProof2.h"
                          ,0xc3,"void Prf_ManCompact(Prf_Man_t *, int)");
          }
          uVar29 = iVar28 * uVar24;
          if (((int)uVar29 < 0) || ((int)uVar12 <= (int)uVar29)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                          ,0x19d,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
          }
          pwVar8 = pVVar6->pArray;
          pwVar3 = pwVar8 + uVar29;
          pPVar5->pInfo = pwVar3;
          if (0 < (int)uVar24) {
            if ((int)uVar26 < 0) {
LAB_004f929d:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                            ,0x1ae,"void Vec_WrdWriteEntry(Vec_Wrd_t *, int, word)");
            }
            uVar29 = uVar12;
            if ((int)uVar12 < (int)uVar26) {
              uVar29 = uVar26;
            }
            uVar25 = 0;
            do {
              if (uVar29 - uVar26 == uVar25) goto LAB_004f929d;
              pwVar8[uVar26 + uVar25] = pwVar3[uVar25];
              uVar25 = uVar25 + 1;
            } while (uVar24 != uVar25);
            uVar26 = uVar26 + (int)uVar25;
          }
          lVar17 = lVar17 + 1;
        } while (lVar17 != iVar20);
      }
      if ((int)uVar12 < (int)uVar26) {
        __assert_fail("p->nSize >= nSizeNew",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecWrd.h"
                      ,0x255,"void Vec_WrdShrink(Vec_Wrd_t *, int)");
      }
      pVVar6->nSize = uVar26;
      pVVar7->nSize = 0;
      pPVar5->pInfo = (word *)0x0;
      uVar24 = pPVar5->iFirst2;
      if (pPVar5->iFirst2 == 0xffffffff) {
        uVar24 = uVar21;
      }
      pPVar5->iFirst = uVar24;
      pPVar5->iFirst2 = -1;
    }
    if ((s->stats).learnts != uVar21) {
      __assert_fail("s->stats.learnts == (unsigned)j",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x5e3,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if (uVar22 != nSize) {
      __assert_fail("Counter == nLearnedOld",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x5e4,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if ((s->act_clas).size < (int)uVar21) {
LAB_004f9357:
      __assert_fail("k <= v->size",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satVec.h"
                    ,0x30,"void veci_resize(veci *, int)");
    }
    (s->act_clas).size = uVar21;
    iVar11 = (s->claProofs).size;
    if (iVar11 != 0) {
      if (iVar11 < (int)uVar21) goto LAB_004f9357;
      (s->claProofs).size = uVar21;
    }
    uVar21 = Sat_MemCompactLearned(&s->Mem,0);
    if (uVar21 != (s->stats).learnts) {
      __assert_fail("Counter == (int)s->stats.learnts",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x5eb,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    uVar25 = (ulong)(uint)s->size;
    if (0 < s->size) {
      pcVar9 = s->reasons;
      lVar17 = 0;
      do {
        uVar21 = pcVar9[lVar17];
        if (((uVar21 & 1) == 0 && uVar21 != 0) && (((s->Mem).uLearnedMask & uVar21) != 0)) {
          if ((*puVar27 & 1) == 0) {
            __assert_fail("c->lrn",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5f6,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          uVar22 = (s->Mem).uPageMask & uVar21;
          if (uVar22 == 0) goto LAB_004f9319;
          piVar13 = (s->Mem).pPages[(int)uVar21 >> ((byte)(s->Mem).nPageSize & 0x1f)];
          uVar21 = piVar13[(int)uVar22];
          if ((uVar21 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x5f8,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          puVar27 = (uint *)(piVar13 + (int)uVar22);
          pcVar9[lVar17] = puVar27[(ulong)(uVar21 >> 0xb) + 1];
          uVar25 = (ulong)(uint)s->size;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)uVar25);
      if (0 < (int)uVar25) {
        pvVar10 = s->wlists;
        lVar17 = 0;
        do {
          iVar11 = pvVar10[lVar17].size;
          if (iVar11 < 1) {
            iVar20 = 0;
          }
          else {
            piVar13 = pvVar10[lVar17].ptr;
            lVar23 = 0;
            iVar20 = 0;
            do {
              uVar21 = piVar13[lVar23];
              if (((uVar21 & 1) == 0) && (((s->Mem).uLearnedMask & uVar21) != 0)) {
                if ((*puVar27 & 1) == 0) {
                  __assert_fail("c->lrn",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                                ,0x608,"void sat_solver2_reducedb(sat_solver2 *)");
                }
                if (uVar21 == 0) {
                  puVar27 = (uint *)0x0;
                }
                else {
                  uVar22 = (s->Mem).uPageMask & uVar21;
                  if (uVar22 == 0) goto LAB_004f9319;
                  puVar27 = (uint *)((s->Mem).pPages
                                     [(int)uVar21 >> ((byte)(s->Mem).nPageSize & 0x1f)] +
                                    (int)uVar22);
                }
                if ((*puVar27 & 2) == 0) {
                  uVar21 = puVar27[(ulong)(*puVar27 >> 0xb) + 1];
                  goto LAB_004f907a;
                }
              }
              else {
LAB_004f907a:
                lVar16 = (long)iVar20;
                iVar20 = iVar20 + 1;
                piVar13[lVar16] = uVar21;
              }
              lVar23 = lVar23 + 1;
              iVar11 = pvVar10[lVar17].size;
            } while (lVar23 < iVar11);
          }
          if (iVar11 < iVar20) goto LAB_004f9357;
          pvVar10[lVar17].size = iVar20;
          lVar17 = lVar17 + 1;
          uVar25 = (ulong)s->size;
        } while (SBORROW8(lVar17,uVar25 * 2) != (long)(lVar17 + uVar25 * -2) < 0);
      }
    }
    if (0 < (int)uVar25 && s->fProofLogging != 0) {
      pcVar9 = s->units;
      lVar17 = 0;
      do {
        uVar21 = pcVar9[lVar17];
        if ((uVar21 != 0) && (((s->Mem).uLearnedMask & uVar21) != 0)) {
          if ((*puVar27 & 1) == 0) {
            __assert_fail("c->lrn",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x616,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          uVar22 = (s->Mem).uPageMask & uVar21;
          if (uVar22 == 0) {
LAB_004f9319:
            __assert_fail("k",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satClause.h"
                          ,0x60,"clause *Sat_MemClause(Sat_Mem_t *, int, int)");
          }
          piVar13 = (s->Mem).pPages[(int)uVar21 >> ((byte)(s->Mem).nPageSize & 0x1f)];
          uVar21 = piVar13[(int)uVar22];
          if ((uVar21 & 2) != 0) {
            __assert_fail("c->mark == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                          ,0x618,"void sat_solver2_reducedb(sat_solver2 *)");
          }
          puVar27 = (uint *)(piVar13 + (int)uVar22);
          pcVar9[lVar17] = puVar27[(ulong)(uVar21 >> 0xb) + 1];
          uVar25 = (ulong)(uint)s->size;
        }
        lVar17 = lVar17 + 1;
      } while (lVar17 < (int)uVar25);
    }
    uVar21 = Sat_MemCompactLearned(&s->Mem,1);
    lVar17 = local_38;
    if (uVar21 != (s->stats).learnts) {
      __assert_fail("Counter == (int)s->stats.learnts",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver2.c"
                    ,0x61e,"void sat_solver2_reducedb(sat_solver2 *)");
    }
    if (s->pPrf1 != (Vec_Set_t *)0x0) {
      iVar11 = Sat_ProofReduce(s->pPrf1,&s->claProofs,s->hProofPivot);
      s->hProofPivot = iVar11;
    }
    iVar20 = 3;
    iVar11 = clock_gettime(3,&local_48);
    if (iVar11 < 0) {
      lVar23 = -1;
    }
    else {
      lVar23 = local_48.tv_nsec / 1000 + local_48.tv_sec * 1000000;
    }
    sat_solver2_reducedb::TimeTotal = sat_solver2_reducedb::TimeTotal + lVar23 + lVar17;
    if (s->fVerbose != 0) {
      uVar25 = (ulong)(s->stats).learnts;
      Abc_Print(iVar20,"reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
                ((double)uVar25 * 100.0) / (double)(int)nSize,uVar25,(ulong)nSize);
      dVar30 = (double)sat_solver2_reducedb::TimeTotal;
      Abc_Print(iVar20,"%s =","Time");
      Abc_Print(iVar20,"%9.2f sec\n",dVar30 / 1000000.0);
    }
  }
  return;
}

Assistant:

void sat_solver2_reducedb(sat_solver2* s)
{
    static abctime TimeTotal = 0;
    Sat_Mem_t * pMem = &s->Mem;
    clause * c = NULL;
    int nLearnedOld = veci_size(&s->act_clas);
    int * act_clas = veci_begin(&s->act_clas);
    int * pPerm, * pSortValues, nCutoffValue, * pClaProofs;
    int i, j, k, Id, nSelected;//, LastSize = 0;
    int Counter, CounterStart;
    abctime clk = Abc_Clock();
    static int Count = 0;
    Count++;
    assert( s->nLearntMax );
    s->nDBreduces++;
//    printf( "Calling reduceDB with %d clause limit and parameters (%d %d %d).\n", s->nLearntMax, s->nLearntStart, s->nLearntDelta, s->nLearntRatio );

/*
    // find the new limit
    s->nLearntMax = s->nLearntMax * 11 / 10;
    // preserve 1/10 of last clauses
    CounterStart  = s->stats.learnts - (s->nLearntMax / 10);
    // preserve 1/10 of most active clauses
    pSortValues = veci_begin(&s->act_clas);
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld*9/10]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;
*/


    // find the new limit
    s->nLearntMax = s->nLearntStart + s->nLearntDelta * s->nDBreduces;
    // preserve 1/20 of last clauses
    CounterStart  = nLearnedOld - (s->nLearntMax / 20);
    // preserve 3/4 of most active clauses
    nSelected = nLearnedOld*s->nLearntRatio/100;
    // create sorting values
    pSortValues = ABC_ALLOC( int, nLearnedOld );
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        Id = clause_id(c);
        pSortValues[Id] = (((7 - Abc_MinInt(c->lbd, 7)) << 28) | (act_clas[Id] >> 4));
//        pSortValues[Id] = act_clas[Id];
        assert( pSortValues[Id] >= 0 );
    }
    // find non-decreasing permutation
    pPerm = Abc_MergeSortCost( pSortValues, nLearnedOld );
    assert( pSortValues[pPerm[0]] <= pSortValues[pPerm[nLearnedOld-1]] );
    nCutoffValue = pSortValues[pPerm[nLearnedOld-nSelected]];
    ABC_FREE( pPerm );
//    nCutoffValue = ABC_INFINITY;

    // count how many clauses satisfy the condition
    Counter = j = 0;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
        }
        else
            j++;
        if ( j >= nLearnedOld / 6 )
            break;
    }
    if ( j < nLearnedOld / 6 )
    {
        ABC_FREE( pSortValues );
        return;
    }

    // mark learned clauses to remove
    Counter = j = 0;
    pClaProofs = veci_size(&s->claProofs) ? veci_begin(&s->claProofs) : NULL;
    Sat_MemForEachLearned( pMem, c, i, k )
    {
        assert( c->mark == 0 );
        if ( Counter++ > CounterStart || clause_size(c) < 2 || pSortValues[clause_id(c)] >= nCutoffValue || s->reasons[lit_var(c->lits[0])] == Sat_MemHand(pMem, i, k) )
        {
            pSortValues[j] = pSortValues[clause_id(c)];
            if ( pClaProofs ) 
                pClaProofs[j] = pClaProofs[clause_id(c)];
            if ( s->pPrf2 )
                Prf_ManAddSaved( s->pPrf2, clause_id(c), j );
            j++;
        }
        else // delete
        {
            c->mark = 1;
            s->stats.learnts_literals -= clause_size(c);
            s->stats.learnts--;
        }
    }
    ABC_FREE( pSortValues );
    if ( s->pPrf2 )
        Prf_ManCompact( s->pPrf2, j );
//    if ( j == nLearnedOld )
//        return;

    assert( s->stats.learnts == (unsigned)j );
    assert( Counter == nLearnedOld );
    veci_resize(&s->act_clas,j);
    if ( veci_size(&s->claProofs) )
        veci_resize(&s->claProofs,j);

    // update ID of each clause to be its new handle
    Counter = Sat_MemCompactLearned( pMem, 0 );
    assert( Counter == (int)s->stats.learnts );

    // update reasons
    for ( i = 0; i < s->size; i++ )
    {
        if ( !s->reasons[i] ) // no reason
            continue;
        if ( clause_is_lit(s->reasons[i]) ) // 2-lit clause
            continue;
        if ( !clause_learnt_h(pMem, s->reasons[i]) ) // problem clause
            continue;
        assert( c->lrn );
        c = clause2_read( s, s->reasons[i] );
        assert( c->mark == 0 );
        s->reasons[i] = clause_id(c); // updating handle here!!!
    }

    // update watches
    for ( i = 0; i < s->size*2; i++ )
    {
        int * pArray = veci_begin(&s->wlists[i]);
        for ( j = k = 0; k < veci_size(&s->wlists[i]); k++ )
        {
            if ( clause_is_lit(pArray[k]) ) // 2-lit clause
                pArray[j++] = pArray[k];
            else if ( !clause_learnt_h(pMem, pArray[k]) ) // problem clause
                pArray[j++] = pArray[k];
            else 
            {
                assert( c->lrn );
                c = clause2_read(s, pArray[k]);
                if ( !c->mark ) // useful learned clause
                   pArray[j++] = clause_id(c); // updating handle here!!!
            }
        }
        veci_resize(&s->wlists[i],j);
    }

    // compact units
    if ( s->fProofLogging )
        for ( i = 0; i < s->size; i++ )
            if ( s->units[i] && clause_learnt_h(pMem, s->units[i]) )
            {
                assert( c->lrn );
                c = clause2_read( s, s->units[i] );
                assert( c->mark == 0 );
                s->units[i] = clause_id(c);
            }

    // perform final move of the clauses
    Counter = Sat_MemCompactLearned( pMem, 1 );
    assert( Counter == (int)s->stats.learnts );

    // compact proof (compacts 'proofs' and update 'claProofs')
    if ( s->pPrf1 )
    {
        extern int Sat_ProofReduce( Vec_Set_t * vProof, void * pRoots, int hProofPivot );
        s->hProofPivot = Sat_ProofReduce( s->pPrf1, &s->claProofs, s->hProofPivot );
    }

    // report the results
    TimeTotal += Abc_Clock() - clk;
    if ( s->fVerbose )
    {
        Abc_Print(1, "reduceDB: Keeping %7d out of %7d clauses (%5.2f %%)  ",
            s->stats.learnts, nLearnedOld, 100.0 * s->stats.learnts / nLearnedOld );
        Abc_PrintTime( 1, "Time", TimeTotal );
    }
}